

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

shared_ptr<fasttext::Matrix> __thiscall fasttext::FastText::createRandomMatrix(FastText *this)

{
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  DenseMatrix *in_RSI;
  element_type *in_RDI;
  shared_ptr<fasttext::Matrix> sVar1;
  shared_ptr<fasttext::DenseMatrix> input;
  shared_ptr<fasttext::DenseMatrix> *in_stack_ffffffffffffff88;
  element_type *this_01;
  int *in_stack_ffffffffffffffb8;
  int32_t in_stack_ffffffffffffffe4;
  uint in_stack_ffffffffffffffe8;
  real in_stack_ffffffffffffffec;
  DenseMatrix *this_02;
  
  this_01 = in_RDI;
  this_02 = in_RSI;
  this_00 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1959fe);
  Dictionary::nwords(this_00);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x195a14);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x195a31);
  std::make_shared<fasttext::DenseMatrix,int,int&>(in_stack_ffffffffffffffb8,(int *)in_RSI);
  std::__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::DenseMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x195a59);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x195a68);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x195a90);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x195aa4);
  DenseMatrix::uniform
            (this_02,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  std::shared_ptr<fasttext::Matrix>::shared_ptr<fasttext::DenseMatrix,void>
            ((shared_ptr<fasttext::Matrix> *)this_01,in_stack_ffffffffffffff88);
  std::shared_ptr<fasttext::DenseMatrix>::~shared_ptr((shared_ptr<fasttext::DenseMatrix> *)0x195ad9)
  ;
  sVar1.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<fasttext::Matrix>)
         sVar1.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Matrix> FastText::createRandomMatrix() const {
  std::shared_ptr<DenseMatrix> input = std::make_shared<DenseMatrix>(
      dict_->nwords() + args_->bucket, args_->dim);
  input->uniform(1.0 / args_->dim, args_->thread, args_->seed);

  return input;
}